

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.cpp
# Opt level: O3

void __thiscall Link::Link(Link *this,char *name)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,name,&local_31);
  MetaSim::Entity::Entity(&this->super_Entity,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR__Link_00127518;
  return;
}

Assistant:

Link::Link(const char *name) : Entity(name)
{
}